

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_IArrayBox.cpp
# Opt level: O0

void __thiscall
amrex::IArrayBox::IArrayBox(IArrayBox *this,Box *b,int n,bool alloc,bool shared,Arena *ar)

{
  byte bVar1;
  byte in_CL;
  byte bVar2;
  undefined4 in_EDX;
  BaseFab<int> *in_RSI;
  undefined8 *in_RDI;
  byte in_R8B;
  BaseFab<int> *in_R9;
  Arena *in_stack_ffffffffffffffc8;
  undefined4 in_stack_ffffffffffffffd8;
  undefined4 in_stack_ffffffffffffffdc;
  undefined2 in_stack_ffffffffffffffe8;
  
  bVar2 = in_CL & 1;
  bVar1 = in_R8B & 1;
  BaseFab<int>::BaseFab
            (in_R9,(Box *)CONCAT44(in_stack_ffffffffffffffdc,in_stack_ffffffffffffffd8),
             (int)((ulong)in_RDI >> 0x20),SUB81((ulong)in_RDI >> 0x18,0),
             SUB81((ulong)in_RDI >> 0x10,0),in_stack_ffffffffffffffc8);
  *in_RDI = &PTR__IArrayBox_01802dc0;
  if (((bVar2 & 1) != 0) && ((do_initval & 1) != 0)) {
    std::numeric_limits<int>::max();
    BaseFab<int>::setVal<(amrex::RunOn)1>
              (in_RSI,(int *)CONCAT44(in_EDX,CONCAT13(bVar2,CONCAT12(bVar1,in_stack_ffffffffffffffe8
                                                                    ))));
  }
  return;
}

Assistant:

IArrayBox::IArrayBox (const Box& b, int n, bool alloc, bool shared, Arena* ar)
    : BaseFab<int>(b,n,alloc,shared,ar)
{
#ifndef AMREX_USE_GPU
    // For debugging purposes
    if ( alloc && do_initval ) {
        setVal<RunOn::Host>(std::numeric_limits<int>::max());
    }
#endif
}